

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O0

Image<float,_gimage::PixelTraits<float>_> *
gimage::downscaleImage<float>(Image<float,_gimage::PixelTraits<float>_> *image,int factor)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  work_t_conflict wVar6;
  int ii_2;
  int kk_2;
  float *in_2;
  int n_2;
  work_t v_2;
  long i_1;
  int ii_1;
  int kk_1;
  float *in_1;
  int n_1;
  work_t v_1;
  int ii;
  int kk;
  float *in;
  int n;
  work_t v;
  long i;
  long k;
  float *out;
  int d;
  Image<float,_gimage::PixelTraits<float>_> *ret;
  store_t_conflict in_stack_fffffffffffffecc;
  work_t_conflict in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  int local_98;
  int local_94;
  float *local_90;
  int local_88;
  float local_84;
  long local_80;
  int local_78;
  int local_74;
  float *local_70;
  int local_64;
  float local_60;
  int local_50;
  int local_4c;
  float *local_48;
  int local_40;
  float local_3c;
  long local_38;
  long local_30;
  float *local_28;
  int local_20;
  int local_18;
  int local_14;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  
  local_18 = 1;
  local_10 = in_RSI;
  piVar3 = std::max<int>(&local_18,&local_14);
  local_14 = *piVar3;
  if (local_14 == 1) {
    Image<float,_gimage::PixelTraits<float>_>::Image
              ((Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
  }
  else {
    Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
    Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
    Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10);
    Image<float,_gimage::PixelTraits<float>_>::Image
              ((Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (long)in_stack_fffffffffffffed8,
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (int)in_stack_fffffffffffffecc);
    for (local_20 = 0; iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10),
        local_20 < iVar2; local_20 = local_20 + 1) {
      local_28 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RDI,0,0,local_20);
      for (local_30 = 0; lVar5 = (long)local_14,
          lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10),
          local_30 + lVar5 <= lVar4; local_30 = local_14 + local_30) {
        for (local_38 = 0; lVar5 = (long)local_14,
            lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10),
            local_38 + lVar5 <= lVar4; local_38 = local_14 + local_38) {
          local_3c = 0.0;
          local_40 = 0;
          local_48 = Image<float,_gimage::PixelTraits<float>_>::getPtr
                               (local_10,local_38,local_30,local_20);
          for (local_4c = 0; local_4c < local_14; local_4c = local_4c + 1) {
            for (local_50 = 0; local_50 < local_14; local_50 = local_50 + 1) {
              bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                                ((Image<float,_gimage::PixelTraits<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                 in_stack_fffffffffffffecc);
              if (bVar1) {
                local_3c = local_48[local_50] + local_3c;
                local_40 = local_40 + 1;
              }
            }
            lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
            local_48 = local_48 + lVar4;
          }
          if (local_40 < 1) {
            wVar6 = PixelTraits<float>::invalid();
            *local_28 = wVar6;
          }
          else {
            *local_28 = local_3c / (float)local_40;
          }
          local_28 = local_28 + 1;
        }
        lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
        if (local_38 < lVar4) {
          local_60 = 0.0;
          local_64 = 0;
          local_70 = Image<float,_gimage::PixelTraits<float>_>::getPtr
                               (local_10,local_38,local_30,local_20);
          for (local_74 = 0; local_74 < local_14; local_74 = local_74 + 1) {
            local_78 = 0;
            while( true ) {
              bVar1 = false;
              if (local_78 < local_14) {
                lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
                bVar1 = local_38 + local_78 < lVar4;
              }
              if (!bVar1) break;
              bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                                ((Image<float,_gimage::PixelTraits<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                 in_stack_fffffffffffffecc);
              if (bVar1) {
                local_60 = local_70[local_78] + local_60;
                local_64 = local_64 + 1;
              }
              local_78 = local_78 + 1;
            }
            lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
            local_70 = local_70 + lVar4;
          }
          if (local_64 < 1) {
            wVar6 = PixelTraits<float>::invalid();
            *local_28 = wVar6;
          }
          else {
            *local_28 = local_60 / (float)local_64;
          }
          local_28 = local_28 + 1;
        }
      }
      lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
      if (local_30 < lVar4) {
        for (local_80 = 0; lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10),
            local_80 < lVar4; local_80 = local_14 + local_80) {
          local_84 = 0.0;
          local_88 = 0;
          local_90 = Image<float,_gimage::PixelTraits<float>_>::getPtr
                               (local_10,local_80,local_30,local_20);
          local_94 = 0;
          while( true ) {
            bVar1 = false;
            if (local_94 < local_14) {
              lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
              bVar1 = local_30 + local_94 < lVar4;
            }
            if (!bVar1) break;
            local_98 = 0;
            while( true ) {
              bVar1 = false;
              if (local_98 < local_14) {
                lVar4 = local_80 + local_98;
                lVar5 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
                bVar1 = lVar4 < lVar5;
              }
              if (!bVar1) break;
              bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                                ((Image<float,_gimage::PixelTraits<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                 in_stack_fffffffffffffecc);
              in_stack_fffffffffffffed4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed4);
              if (bVar1) {
                local_84 = local_90[local_98] + local_84;
                local_88 = local_88 + 1;
              }
              local_98 = local_98 + 1;
            }
            lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
            local_90 = local_90 + lVar4;
            local_94 = local_94 + 1;
          }
          if (local_88 < 1) {
            in_stack_fffffffffffffed0 = PixelTraits<float>::invalid();
            *local_28 = in_stack_fffffffffffffed0;
          }
          else {
            *local_28 = local_84 / (float)local_88;
          }
          local_28 = local_28 + 1;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

inline Image<float> downscaleImage(const Image<float> &image, int factor)
{
  factor=std::max(1, factor);

  if (factor == 1)
  {
    return image;
  }

  Image<float> ret((image.getWidth()+factor-1)/factor,
                   (image.getHeight()+factor-1)/factor, image.getDepth());

  for (int d=0; d<image.getDepth(); d++)
  {
    float *out=ret.getPtr(0, 0, d);

    long k=0;

    while (k+factor <= image.getHeight())
    {
      long i=0;

      // average over factor*factor pixels of the input image

      while (i+factor <= image.getWidth())
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor; ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }

        i+=factor;
      }

      // if there are less than factor pixels left in the image row, then
      // average with boundary check

      if (i < image.getWidth())
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }
      }

      k+=factor;
    }

    // if there are less than factor image rows left in the image, then
    // average with boundary check

    if (k < image.getHeight())
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }
      }
    }
  }

  return ret;
}